

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

void __thiscall cmFileLockPool::PopFileScope(cmFileLockPool *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  if ((this->FileScopes).
      super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->FileScopes) {
    p_Var2 = (this->FileScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    if (p_Var2 != (_List_node_base *)0x0) {
      ScopePool::~ScopePool((ScopePool *)p_Var2);
      operator_delete(p_Var2,0x18);
    }
    p_Var2 = (this->FileScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    psVar1 = &(this->FileScopes).
              super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    return;
  }
  __assert_fail("!this->FileScopes.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmFileLockPool.cxx"
                ,0x32,"void cmFileLockPool::PopFileScope()");
}

Assistant:

void cmFileLockPool::PopFileScope()
{
  assert(!this->FileScopes.empty());
  delete this->FileScopes.back();
  this->FileScopes.pop_back();
}